

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

bool __thiscall QRectF::intersects(QRectF *this,QRectF *r)

{
  qreal b2;
  qreal t2;
  qreal b1;
  qreal t1;
  qreal r2;
  qreal l2;
  qreal r1;
  qreal l1;
  QRectF *r_local;
  QRectF *this_local;
  bool local_1;
  
  l1 = this->xp;
  r1 = this->xp;
  if (0.0 < this->w || this->w == 0.0) {
    r1 = this->w + r1;
  }
  else {
    l1 = this->w + l1;
  }
  if ((l1 != r1) || (NAN(l1) || NAN(r1))) {
    l2 = r->xp;
    r2 = r->xp;
    if (0.0 < r->w || r->w == 0.0) {
      r2 = r->w + r2;
    }
    else {
      l2 = r->w + l2;
    }
    if ((l2 != r2) || (NAN(l2) || NAN(r2))) {
      if ((r2 <= l1) || (r1 <= l2)) {
        local_1 = false;
      }
      else {
        t1 = this->yp;
        b1 = this->yp;
        if (0.0 < this->h || this->h == 0.0) {
          b1 = this->h + b1;
        }
        else {
          t1 = this->h + t1;
        }
        if ((t1 != b1) || (NAN(t1) || NAN(b1))) {
          t2 = r->yp;
          b2 = r->yp;
          if (0.0 < r->h || r->h == 0.0) {
            b2 = r->h + b2;
          }
          else {
            t2 = r->h + t2;
          }
          if ((t2 != b2) || (NAN(t2) || NAN(b2))) {
            if ((b2 <= t1) || (b1 <= t2)) {
              local_1 = false;
            }
            else {
              local_1 = true;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QRectF::intersects(const QRectF &r) const noexcept
{
    qreal l1 = xp;
    qreal r1 = xp;
    if (w < 0)
        l1 += w;
    else
        r1 += w;
    if (l1 == r1) // null rect
        return false;

    qreal l2 = r.xp;
    qreal r2 = r.xp;
    if (r.w < 0)
        l2 += r.w;
    else
        r2 += r.w;
    if (l2 == r2) // null rect
        return false;

    if (l1 >= r2 || l2 >= r1)
        return false;

    qreal t1 = yp;
    qreal b1 = yp;
    if (h < 0)
        t1 += h;
    else
        b1 += h;
    if (t1 == b1) // null rect
        return false;

    qreal t2 = r.yp;
    qreal b2 = r.yp;
    if (r.h < 0)
        t2 += r.h;
    else
        b2 += r.h;
    if (t2 == b2) // null rect
        return false;

    if (t1 >= b2 || t2 >= b1)
        return false;

    return true;
}